

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SzArEx_Open2(CSzArEx *p,ILookInStream *inStream,ISzAlloc *allocMain,ISzAlloc *allocTemp)

{
  int iVar1;
  UInt32 UVar2;
  undefined1 local_128 [8];
  CBuf tempBuf;
  CSzAr tempAr;
  UInt64 type;
  CSzData sd;
  int __result___3;
  int __result___2;
  Int64 pos;
  SRes local_98;
  int __result___1;
  int __result__;
  SRes res;
  CBuf buf;
  UInt32 nextHeaderCRC;
  size_t nextHeaderSizeT;
  UInt64 nextHeaderSize;
  UInt64 nextHeaderOffset;
  Int64 startArcPos;
  Byte header [32];
  ISzAlloc *allocTemp_local;
  ISzAlloc *allocMain_local;
  ILookInStream *inStream_local;
  CSzArEx *p_local;
  
  nextHeaderOffset = 0;
  local_98 = (*inStream->Seek)(inStream,(Int64 *)&nextHeaderOffset,SZ_SEEK_CUR);
  p_local._4_4_ = local_98;
  if ((local_98 == 0) &&
     (pos._4_4_ = LookInStream_Read2(inStream,&startArcPos,0x20,0x11), p_local._4_4_ = pos._4_4_,
     pos._4_4_ == 0)) {
    iVar1 = TestSignatureCandidate((Byte *)&startArcPos);
    if (iVar1 == 0) {
      p_local._4_4_ = 0x11;
    }
    else if (startArcPos._6_1_ == '\0') {
      buf.size._4_1_ = header[0x14];
      buf.size._5_1_ = header[0x15];
      buf.size._6_1_ = header[0x16];
      buf.size._7_1_ = header[0x17];
      p->startPosAfterHeader = nextHeaderOffset + 0x20;
      UVar2 = CrcCalc(header + 4,0x14);
      if (UVar2 == header._0_4_) {
        if (header._12_8_ == 0) {
          p_local._4_4_ = 0;
        }
        else if (((ulong)(header._4_8_ + header._12_8_) < (ulong)header._4_8_) ||
                (header._4_8_ + header._12_8_ + 0x20 < (ulong)header._4_8_)) {
          p_local._4_4_ = 0x11;
        }
        else {
          ___result___3 = 0;
          sd.Size._4_4_ = (*inStream->Seek)(inStream,(Int64 *)&__result___3,SZ_SEEK_END);
          p_local._4_4_ = sd.Size._4_4_;
          if (sd.Size._4_4_ == 0) {
            if (((___result___3 < nextHeaderOffset + header._4_8_) ||
                (___result___3 < nextHeaderOffset + 0x20 + header._4_8_)) ||
               (___result___3 < nextHeaderOffset + 0x20 + header._4_8_ + header._12_8_)) {
              p_local._4_4_ = 6;
            }
            else {
              sd.Size._0_4_ = LookInStream_SeekTo(inStream,nextHeaderOffset + 0x20 + header._4_8_);
              p_local._4_4_ = (SRes)sd.Size;
              if ((SRes)sd.Size == 0) {
                iVar1 = Buf_Create((CBuf *)&__result__,header._12_8_,allocTemp);
                if (iVar1 == 0) {
                  p_local._4_4_ = 2;
                }
                else {
                  __result___1 = LookInStream_Read(inStream,___result__,header._12_8_);
                  if (__result___1 == 0) {
                    __result___1 = 0x10;
                    UVar2 = CrcCalc(___result__,header._12_8_);
                    if (UVar2 == buf.size._4_4_) {
                      type = (UInt64)___result__;
                      sd.Data = buf.data;
                      __result___1 = ReadNumber((CSzData *)&type,(UInt64 *)&tempAr.CodersData);
                      if ((__result___1 == 0) && (tempAr.CodersData == (Byte *)0x17)) {
                        Buf_Init((CBuf *)local_128);
                        SzAr_Init((CSzAr *)&tempBuf.size);
                        __result___1 = SzReadAndDecodePackedStreams
                                                 (inStream,(CSzData *)&type,(CBuf *)local_128,1,
                                                  p->startPosAfterHeader,(CSzAr *)&tempBuf.size,
                                                  allocTemp);
                        SzAr_Free((CSzAr *)&tempBuf.size,allocTemp);
                        if (__result___1 == 0) {
                          Buf_Free((CBuf *)&__result__,allocTemp);
                          ___result__ = (Byte *)local_128;
                          buf.data = tempBuf.data;
                          type = (UInt64)local_128;
                          sd.Data = tempBuf.data;
                          __result___1 = ReadNumber((CSzData *)&type,(UInt64 *)&tempAr.CodersData);
                        }
                        else {
                          Buf_Free((CBuf *)local_128,allocTemp);
                        }
                      }
                      if (__result___1 == 0) {
                        if (tempAr.CodersData == (Byte *)0x1) {
                          __result___1 = SzReadHeader(p,(CSzData *)&type,inStream,allocMain,
                                                      allocTemp);
                        }
                        else {
                          __result___1 = 4;
                        }
                      }
                    }
                  }
                  Buf_Free((CBuf *)&__result__,allocTemp);
                  p_local._4_4_ = __result___1;
                }
              }
            }
          }
        }
      }
      else {
        p_local._4_4_ = 3;
      }
    }
    else {
      p_local._4_4_ = 4;
    }
  }
  return p_local._4_4_;
}

Assistant:

static SRes SzArEx_Open2(
    CSzArEx *p,
    ILookInStream *inStream,
    ISzAlloc *allocMain,
    ISzAlloc *allocTemp)
{
  Byte header[k7zStartHeaderSize];
  Int64 startArcPos;
  UInt64 nextHeaderOffset, nextHeaderSize;
  size_t nextHeaderSizeT;
  UInt32 nextHeaderCRC;
  CBuf buf;
  SRes res;

  startArcPos = 0;
  RINOK(inStream->Seek(inStream, &startArcPos, SZ_SEEK_CUR));

  RINOK(LookInStream_Read2(inStream, header, k7zStartHeaderSize, SZ_ERROR_NO_ARCHIVE));

  if (!TestSignatureCandidate(header))
    return SZ_ERROR_NO_ARCHIVE;
  if (header[6] != k7zMajorVersion)
    return SZ_ERROR_UNSUPPORTED;

  nextHeaderOffset = GetUi64(header + 12);
  nextHeaderSize = GetUi64(header + 20);
  nextHeaderCRC = GetUi32(header + 28);

  p->startPosAfterHeader = startArcPos + k7zStartHeaderSize;
  
  if (CrcCalc(header + 12, 20) != GetUi32(header + 8))
    return SZ_ERROR_CRC;

  nextHeaderSizeT = (size_t)nextHeaderSize;
  if (nextHeaderSizeT != nextHeaderSize)
    return SZ_ERROR_MEM;
  if (nextHeaderSizeT == 0)
    return SZ_OK;
  if (nextHeaderOffset > nextHeaderOffset + nextHeaderSize ||
      nextHeaderOffset > nextHeaderOffset + nextHeaderSize + k7zStartHeaderSize)
    return SZ_ERROR_NO_ARCHIVE;

  {
    Int64 pos = 0;
    RINOK(inStream->Seek(inStream, &pos, SZ_SEEK_END));
    if ((UInt64)pos < startArcPos + nextHeaderOffset ||
        (UInt64)pos < startArcPos + k7zStartHeaderSize + nextHeaderOffset ||
        (UInt64)pos < startArcPos + k7zStartHeaderSize + nextHeaderOffset + nextHeaderSize)
      return SZ_ERROR_INPUT_EOF;
  }

  RINOK(LookInStream_SeekTo(inStream, startArcPos + k7zStartHeaderSize + nextHeaderOffset));

  if (!Buf_Create(&buf, nextHeaderSizeT, allocTemp))
    return SZ_ERROR_MEM;

  res = LookInStream_Read(inStream, buf.data, nextHeaderSizeT);
  
  if (res == SZ_OK)
  {
    res = SZ_ERROR_ARCHIVE;
    if (CrcCalc(buf.data, nextHeaderSizeT) == nextHeaderCRC)
    {
      CSzData sd;
      UInt64 type;
      sd.Data = buf.data;
      sd.Size = buf.size;
      
      res = ReadID(&sd, &type);
      
      if (res == SZ_OK && type == k7zIdEncodedHeader)
      {
        CSzAr tempAr;
        CBuf tempBuf;
        Buf_Init(&tempBuf);
        
        SzAr_Init(&tempAr);
        res = SzReadAndDecodePackedStreams(inStream, &sd, &tempBuf, 1, p->startPosAfterHeader, &tempAr, allocTemp);
        SzAr_Free(&tempAr, allocTemp);
       
        if (res != SZ_OK)
        {
          Buf_Free(&tempBuf, allocTemp);
        }
        else
        {
          Buf_Free(&buf, allocTemp);
          buf.data = tempBuf.data;
          buf.size = tempBuf.size;
          sd.Data = buf.data;
          sd.Size = buf.size;
          res = ReadID(&sd, &type);
        }
      }
  
      if (res == SZ_OK)
      {
        if (type == k7zIdHeader)
        {
          /*
          CSzData sd2;
          unsigned ttt;
          for (ttt = 0; ttt < 40000; ttt++)
          {
            SzArEx_Free(p, allocMain);
            sd2 = sd;
            res = SzReadHeader(p, &sd2, inStream, allocMain, allocTemp);
            if (res != SZ_OK)
              break;
          }
          */
          res = SzReadHeader(p, &sd, inStream, allocMain, allocTemp);
        }
        else
          res = SZ_ERROR_UNSUPPORTED;
      }
    }
  }
 
  Buf_Free(&buf, allocTemp);
  return res;
}